

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            *this,uint numberOfColumns,Column_settings *colSettings)

{
  Barcode *pBVar1;
  Row_dictionary *this_00;
  pointer puVar2;
  pointer puVar3;
  double dVar4;
  ulong __n;
  ulong uVar5;
  __hashtable *__this_1;
  __hashtable *__this;
  allocator_type local_4b;
  allocator_type local_4a;
  allocator_type local_49;
  R_matrix *local_48;
  double local_40;
  value_type_conflict1 local_34;
  
  __n = (ulong)numberOfColumns;
  *(undefined8 *)&(this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_rehash_policy
       = 0;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_buckets =
       &(this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_single_bucket;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_bucket_count = 1;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_element_count = 0;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize
       = 0;
  (this->super_RU_vine_swap_option).super_type.super_type.map_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  pBVar1 = &(this->super_RU_vine_swap_option).super_type.barcode_;
  *(Barcode **)
   ((long)&(this->super_RU_vine_swap_option).super_type.barcode_.
           super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pBVar1;
  (this->super_RU_vine_swap_option).super_type.barcode_.
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pBVar1;
  (this->super_RU_vine_swap_option).super_type.barcode_.
  super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_buckets =
       &(this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_single_bucket;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_bucket_count = 1;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_element_count = 0;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_RU_vine_swap_option).super_type.indexToBar_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_buckets =
       &(this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_single_bucket;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_bucket_count = 1;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_element_count = 0;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_rehash_policy._M_next_resize =
       0;
  (this->super_RU_vine_swap_option).super_type.idToPosition_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_RU_representative_cycles_option).birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  ::Boundary_matrix(&this->reducedMatrixR_,numberOfColumns,colSettings);
  local_48 = &this->reducedMatrixR_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this->mirrorMatrixU_,__n,
             &local_49);
  this_00 = &(this->mirrorMatrixU_).
             super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_true,_true>_>_>_>
             .rowToIndex_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,__n,&local_4a);
  (this->mirrorMatrixU_).
  super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_true,_true>_>_>_>
  .rowSwapped_ = false;
  if (numberOfColumns != 0) {
    puVar2 = (this->mirrorMatrixU_).
             super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_true,_true>_>_>_>
             .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      puVar2[uVar5] = (uint)uVar5;
      puVar3[uVar5] = (uint)uVar5;
      uVar5 = uVar5 + 1;
    } while (__n != uVar5);
  }
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
  ::vector(&(this->mirrorMatrixU_).matrix_,__n,&local_4b);
  (this->mirrorMatrixU_).nextInsertIndex_ = 0;
  (this->mirrorMatrixU_).colSettings_ = colSettings;
  this->operators_ = (Field_operators *)0x0;
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_34 = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->pivotToColumnIndex_,__n,&local_34);
  local_40 = (double)__n;
  dVar4 = ceil(local_40 /
               (double)(this->super_RU_vine_swap_option).super_type.indexToBar_._M_h.
                       _M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->super_RU_vine_swap_option).super_type.indexToBar_._M_h,
           (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
  dVar4 = ceil(local_40 /
               (double)(this->super_RU_vine_swap_option).super_type.super_type.map_._M_h.
                       _M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)this,(long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(unsigned int numberOfColumns, Column_settings* colSettings)
    : Pair_opt(),
      Swap_opt(),
      Rep_opt(),
      reducedMatrixR_(numberOfColumns, colSettings),
      mirrorMatrixU_(numberOfColumns, colSettings),
      nextEventIndex_(0),
      operators_(nullptr)
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(numberOfColumns);
  }
  if constexpr (Master_matrix::Option_list::has_vine_update) {
    Swap_opt::_positionToRowIdx().reserve(numberOfColumns);
  }
}